

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseBlockInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Token *pTVar1;
  Expr *pEVar2;
  IfExceptExpr *pIVar3;
  bool bVar4;
  TokenType TVar5;
  Result RVar6;
  undefined8 uVar7;
  Token local_188;
  Token local_138;
  Token local_e8;
  undefined1 local_98 [8];
  Location loc;
  unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> expr;
  size_t local_68;
  undefined8 uStack_60;
  IfExceptExpr *local_28;
  
  GetLocation((Location *)local_98,this);
  TVar5 = Peek(this,0);
  if (TVar5 == Try) {
    pTVar1 = (Token *)(loc.field_1.field2 + 8);
    Consume(pTVar1,this);
    ErrorUnlessOpcodeEnabled(this,pTVar1);
    Token::~Token((Token *)((long)&loc.field_1 + 8));
    MakeUnique<wabt::TryExpr,wabt::Location&>((wabt *)pTVar1,(Location *)local_98);
    RVar6 = ParseLabelOpt(this,(string *)(loc.field_1._8_8_ + 0x40));
    uVar7 = loc.field_1._8_8_;
    if (((((RVar6.enum_ == Error) ||
          (RVar6 = ParseBlock(this,(Block *)(loc.field_1._8_8_ + 0x40)), uVar7 = loc.field_1._8_8_,
          RVar6.enum_ == Error)) ||
         (RVar6 = Expect(this,Catch), uVar7 = loc.field_1._8_8_, RVar6.enum_ == Error)) ||
        ((RVar6 = ParseEndLabelOpt(this,(string *)(loc.field_1._8_8_ + 0x40)),
         uVar7 = loc.field_1._8_8_, RVar6.enum_ == Error ||
         (RVar6 = ParseTerminatingInstrList(this,(ExprList *)(loc.field_1._8_8_ + 0x118)),
         uVar7 = loc.field_1._8_8_, RVar6.enum_ == Error)))) ||
       (RVar6 = Expect(this,End), uVar7 = loc.field_1._8_8_, RVar6.enum_ == Error))
    goto LAB_00daad5b;
    RVar6 = ParseEndLabelOpt(this,(string *)(loc.field_1._8_8_ + 0x40));
LAB_00daad52:
    uVar7 = loc.field_1._8_8_;
    if (RVar6.enum_ == Error) goto LAB_00daad5b;
    loc.field_1._8_8_ = 0;
    pEVar2 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)uVar7;
    if (pEVar2 == (Expr *)0x0) {
      return (Result)Ok;
    }
    (*pEVar2->_vptr_Expr[1])();
    uVar7 = loc.field_1._8_8_;
  }
  else {
    if (TVar5 == IfExcept) {
      pTVar1 = (Token *)((long)&loc.field_1 + 8);
      Consume(pTVar1,this);
      ErrorUnlessOpcodeEnabled(this,pTVar1);
      Token::~Token((Token *)((long)&loc.field_1 + 8));
      MakeUnique<wabt::IfExceptExpr,wabt::Location&>((wabt *)&local_28,(Location *)local_98);
      RVar6 = ParseIfExceptHeader(this,local_28);
      uVar7 = local_28;
      if ((RVar6.enum_ == Error) ||
         (RVar6 = ParseInstrList(this,&(local_28->true_).exprs), uVar7 = local_28,
         RVar6.enum_ == Error)) goto LAB_00daad5b;
      GetLocation((Location *)((long)&loc.field_1 + 8),this);
      (local_28->true_).end_loc.field_1.field_1.offset = local_68;
      *(undefined8 *)((long)&(local_28->true_).end_loc.field_1 + 8) = uStack_60;
      (local_28->true_).end_loc.filename.data_ = loc.field_1._8_8_;
      (local_28->true_).end_loc.filename.size_ =
           (size_type)
           expr._M_t.super___uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>._M_t.
           super__Tuple_impl<0UL,_wabt::TryExpr_*,_std::default_delete<wabt::TryExpr>_>.
           super__Head_base<0UL,_wabt::TryExpr_*,_false>._M_head_impl;
      bVar4 = Match(this,Else);
      if (bVar4) {
        RVar6 = ParseEndLabelOpt(this,&(local_28->true_).label);
        uVar7 = local_28;
        if ((RVar6.enum_ == Error) ||
           (RVar6 = ParseTerminatingInstrList(this,&local_28->false_), uVar7 = local_28,
           RVar6.enum_ == Error)) goto LAB_00daad5b;
        GetLocation((Location *)((long)&loc.field_1 + 8),this);
        (local_28->false_end_loc).field_1.field_1.offset = local_68;
        *(undefined8 *)((long)&(local_28->false_end_loc).field_1 + 8) = uStack_60;
        (local_28->false_end_loc).filename.data_ = (char *)loc.field_1._8_8_;
        (local_28->false_end_loc).filename.size_ =
             (size_type)
             expr._M_t.super___uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::TryExpr_*,_std::default_delete<wabt::TryExpr>_>.
             super__Head_base<0UL,_wabt::TryExpr_*,_false>._M_head_impl;
      }
      RVar6 = Expect(this,End);
      uVar7 = local_28;
      if (RVar6.enum_ == Error) goto LAB_00daad5b;
      RVar6 = ParseEndLabelOpt(this,&(local_28->true_).label);
    }
    else {
      if (TVar5 != If) {
        if (TVar5 == Loop) {
          Consume(&local_138,this);
          Token::~Token(&local_138);
          MakeUnique<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Location&>
                    ((wabt *)(loc.field_1.field2 + 8),(Location *)local_98);
          RVar6 = ParseLabelOpt(this,(string *)(loc.field_1._8_8_ + 0x40));
          uVar7 = loc.field_1._8_8_;
          if (((RVar6.enum_ == Error) ||
              (RVar6 = ParseBlock(this,(Block *)(loc.field_1._8_8_ + 0x40)),
              uVar7 = loc.field_1._8_8_, RVar6.enum_ == Error)) ||
             (RVar6 = Expect(this,End), uVar7 = loc.field_1._8_8_, RVar6.enum_ == Error))
          goto LAB_00daad5b;
          RVar6 = ParseEndLabelOpt(this,(string *)(loc.field_1._8_8_ + 0x40));
        }
        else {
          if (TVar5 != Block) {
            __assert_fail("!\"ParseBlockInstr should only be called when IsBlockInstr() is true\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wast-parser.cc"
                          ,0x72d,"Result wabt::WastParser::ParseBlockInstr(std::unique_ptr<Expr> *)"
                         );
          }
          Consume(&local_188,this);
          Token::~Token(&local_188);
          MakeUnique<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Location&>
                    ((wabt *)(loc.field_1.field2 + 8),(Location *)local_98);
          RVar6 = ParseLabelOpt(this,(string *)(loc.field_1._8_8_ + 0x40));
          uVar7 = loc.field_1._8_8_;
          if (((RVar6.enum_ == Error) ||
              (RVar6 = ParseBlock(this,(Block *)(loc.field_1._8_8_ + 0x40)),
              uVar7 = loc.field_1._8_8_, RVar6.enum_ == Error)) ||
             (RVar6 = Expect(this,End), uVar7 = loc.field_1._8_8_, RVar6.enum_ == Error))
          goto LAB_00daad5b;
          RVar6 = ParseEndLabelOpt(this,(string *)(loc.field_1._8_8_ + 0x40));
        }
        goto LAB_00daad52;
      }
      Consume(&local_e8,this);
      Token::~Token(&local_e8);
      MakeUnique<wabt::IfExpr,wabt::Location&>((wabt *)&local_28,(Location *)local_98);
      RVar6 = ParseLabelOpt(this,&(local_28->true_).label);
      uVar7 = local_28;
      if ((RVar6.enum_ == Error) ||
         (RVar6 = ParseBlock(this,&local_28->true_), uVar7 = local_28, RVar6.enum_ == Error))
      goto LAB_00daad5b;
      bVar4 = Match(this,Else);
      if (bVar4) {
        RVar6 = ParseEndLabelOpt(this,&(local_28->true_).label);
        uVar7 = local_28;
        if ((RVar6.enum_ == Error) ||
           (RVar6 = ParseTerminatingInstrList(this,&local_28->false_), uVar7 = local_28,
           RVar6.enum_ == Error)) goto LAB_00daad5b;
        GetLocation((Location *)((long)&loc.field_1 + 8),this);
        (local_28->false_end_loc).field_1.field_1.offset = local_68;
        *(undefined8 *)((long)&(local_28->false_end_loc).field_1 + 8) = uStack_60;
        (local_28->false_end_loc).filename.data_ = (char *)loc.field_1._8_8_;
        (local_28->false_end_loc).filename.size_ =
             (size_type)
             expr._M_t.super___uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::TryExpr_*,_std::default_delete<wabt::TryExpr>_>.
             super__Head_base<0UL,_wabt::TryExpr_*,_false>._M_head_impl;
      }
      RVar6 = Expect(this,End);
      uVar7 = local_28;
      if (RVar6.enum_ == Error) goto LAB_00daad5b;
      RVar6 = ParseEndLabelOpt(this,&(local_28->true_).label);
    }
    pIVar3 = local_28;
    uVar7 = local_28;
    if (RVar6.enum_ == Error) {
LAB_00daad5b:
      if ((IfExceptExpr *)uVar7 != (IfExceptExpr *)0x0) {
        (*(((IfExceptExpr *)uVar7)->super_ExprMixin<(wabt::ExprType)20>).super_Expr._vptr_Expr[1])()
        ;
      }
      return (Result)Error;
    }
    local_28 = (IfExceptExpr *)0x0;
    pEVar2 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)pIVar3;
    if (pEVar2 == (Expr *)0x0) {
      return (Result)Ok;
    }
    (*pEVar2->_vptr_Expr[1])();
    uVar7 = local_28;
  }
  if ((IfExceptExpr *)uVar7 != (IfExceptExpr *)0x0) {
    (*(((IfExceptExpr *)uVar7)->super_ExprMixin<(wabt::ExprType)20>).super_Expr._vptr_Expr[1])();
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseBlockInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParseBlockInstr);
  Location loc = GetLocation();

  switch (Peek()) {
    case TokenType::Block: {
      Consume();
      auto expr = MakeUnique<BlockExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Loop: {
      Consume();
      auto expr = MakeUnique<LoopExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::If: {
      Consume();
      auto expr = MakeUnique<IfExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
      CHECK_RESULT(ParseBlock(&expr->true_));
      if (Match(TokenType::Else)) {
        CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
        CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
        expr->false_end_loc = GetLocation();
      }
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::IfExcept: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = MakeUnique<IfExceptExpr>(loc);
      CHECK_RESULT(ParseIfExceptHeader(expr.get()));
      CHECK_RESULT(ParseInstrList(&expr->true_.exprs));
      expr->true_.end_loc = GetLocation();
      if (Match(TokenType::Else)) {
        CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
        CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
        expr->false_end_loc = GetLocation();
      }
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Try: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = MakeUnique<TryExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(Catch);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      CHECK_RESULT(ParseTerminatingInstrList(&expr->catch_));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    default:
      assert(
          !"ParseBlockInstr should only be called when IsBlockInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}